

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_AActor_A_Overlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  player_t *this;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  PClass *pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FState *newstate;
  undefined4 extraout_var_01;
  DPSprite *pDVar8;
  AActor *caller;
  char *pcVar9;
  undefined8 *puVar10;
  bool bVar11;
  PClassActor *pPVar7;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_0043c573:
      pcVar9 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0043c58c;
    }
    puVar10 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar10 == (undefined8 *)0x0) goto LAB_0043c33b;
      pPVar6 = (PClass *)puVar10[1];
      if (pPVar6 == (PClass *)0x0) {
        pPVar6 = (PClass *)(**(code **)*puVar10)(puVar10);
        puVar10[1] = pPVar6;
      }
      bVar11 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar2 && bVar11) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar11 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar2) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar11) {
        pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0043c58c;
      }
    }
    else {
      if (puVar10 != (undefined8 *)0x0) goto LAB_0043c573;
LAB_0043c33b:
      puVar10 = (undefined8 *)0x0;
    }
    pPVar2 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type != '\x03') goto LAB_0043c573;
      caller = (AActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (caller == (AActor *)0x0) goto LAB_0043c3cf;
        pPVar6 = (caller->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar3 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar3);
          (caller->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar2 && bVar11) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar11 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar2) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar9 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043c58c;
        }
      }
      else {
        if (caller != (AActor *)0x0) goto LAB_0043c573;
LAB_0043c3cf:
        caller = (AActor *)0x0;
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar9 = "(paramnum) < numparam";
LAB_0043c5b4:
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                          ,0x51a,
                          "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar9 = "param[paramnum].Type == REGT_INT";
            goto LAB_0043c5b4;
          }
          iVar3 = param[3].field_0.i;
          if ((uint)numparam < 5) {
            if (defaultparam->Array[4].field_0.field_3.Type != '\0') {
              pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_0043c5fb;
            }
            iVar1 = defaultparam->Array[4].field_0.i;
            pPVar7 = (PClassActor *)(caller->super_DThinker).super_DObject.Class;
            if (pPVar7 == (PClassActor *)0x0) {
              iVar4 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
              pPVar7 = (PClassActor *)CONCAT44(extraout_var_01,iVar4);
              (caller->super_DThinker).super_DObject.Class = (PClass *)pPVar7;
            }
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar7,false);
          }
          else {
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_0043c5fb:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x51b,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar1 = param[4].field_0.i;
            pPVar7 = (PClassActor *)(caller->super_DThinker).super_DObject.Class;
            if (pPVar7 == (PClassActor *)0x0) {
              iVar4 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
              pPVar7 = (PClassActor *)CONCAT44(extraout_var_00,iVar4);
              (caller->super_DThinker).super_DObject.Class = (PClass *)pPVar7;
            }
            newstate = FStateLabelStorage::GetState(&StateLabels,iVar1,pPVar7,false);
            if (numparam != 5) {
              if (param[5].field_0.field_3.Type != '\0') {
                pcVar9 = "(param[paramnum]).Type == REGT_INT";
                goto LAB_0043c639;
              }
              goto LAB_0043c4c0;
            }
          }
          param = defaultparam->Array;
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043c639:
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                          ,0x51c,
                          "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
LAB_0043c4c0:
          this = (player_t *)puVar10[0x46];
          if ((this == (player_t *)0x0) ||
             ((param[5].field_0.i != 0 &&
              (pDVar8 = player_t::FindPSprite(this,iVar3), pDVar8 != (DPSprite *)0x0)))) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x522,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            uVar5 = 0;
          }
          else {
            pDVar8 = (DPSprite *)
                     M_Malloc_Dbg(0x88,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            DPSprite::DPSprite(pDVar8,this,caller,iVar3);
            DPSprite::SetState(pDVar8,newstate,false);
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x528,
                            "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            uVar5 = 1;
          }
          if (ret->RegType == '\0') {
            *(undefined4 *)ret->Location = uVar5;
            return 1;
          }
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        pcVar9 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_0043c58c;
      }
    }
  }
  pcVar9 = "(paramnum) < numparam";
LAB_0043c58c:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x519,"int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT		(layer);
	PARAM_STATE_ACTION_DEF(state);
	PARAM_BOOL_DEF(dontoverride);

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}